

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser.cxx
# Opt level: O0

void __thiscall Fl_Browser::textsize(Fl_Browser *this,Fl_Fontsize newSize)

{
  Fl_Fontsize FVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long local_20;
  FL_BLINE *itm;
  Fl_Fontsize newSize_local;
  Fl_Browser *this_local;
  
  FVar1 = textsize(this);
  if (newSize != FVar1) {
    Fl_Browser_::textsize(&this->super_Fl_Browser_,newSize);
    Fl_Browser_::new_list(&this->super_Fl_Browser_);
    this->full_height_ = 0;
    if (this->lines != 0) {
      iVar2 = (*(this->super_Fl_Browser_).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[10])();
      local_20 = CONCAT44(extraout_var,iVar2);
      while (local_20 != 0) {
        iVar2 = (*(this->super_Fl_Browser_).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[0xe])
                          (this,local_20);
        this->full_height_ = iVar2 + this->full_height_;
        iVar2 = (*(this->super_Fl_Browser_).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[0xb])
                          (this,local_20);
        local_20 = CONCAT44(extraout_var_00,iVar2);
      }
    }
  }
  return;
}

Assistant:

void Fl_Browser::textsize(Fl_Fontsize newSize) {
  if (newSize == textsize())
    return; // avoid recalculation
  Fl_Browser_::textsize(newSize);
  new_list();
  full_height_ = 0;
  if (lines == 0) return;
  for (FL_BLINE* itm=(FL_BLINE *)item_first(); itm; itm=(FL_BLINE *)item_next(itm)) {
    full_height_ += item_height(itm);
  }
}